

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# like.cpp
# Opt level: O1

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::LikeBindFunction
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  pointer puVar1;
  int iVar2;
  pointer pEVar3;
  reference pvVar4;
  type expr;
  LogicalType *type;
  pointer this_00;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *__range1;
  bool bVar5;
  bool bVar6;
  Value pattern_str;
  undefined1 local_c0 [56];
  pointer local_88;
  undefined1 local_80 [80];
  
  this_00 = (arguments->
            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ).
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (arguments->
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ).
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_c0._8_8_ = context;
  do {
    bVar5 = this_00 == puVar1;
    if (bVar5) {
LAB_014dd868:
      pvVar4 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[](arguments,1);
      pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar4);
      iVar2 = (*(pEVar3->super_BaseExpression)._vptr_BaseExpression[0xf])(pEVar3);
      if ((char)iVar2 == '\0') {
        *(undefined8 *)this = 0;
      }
      else {
        pvVar4 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 ::operator[](arguments,1);
        expr = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator*(pvVar4);
        ExpressionExecutor::EvaluateScalar
                  ((Value *)(local_80 + 0x10),(ClientContext *)local_c0._8_8_,expr,false);
        Value::ToString_abi_cxx11_((string *)(local_c0 + 0x10),(Value *)(local_80 + 0x10));
        LikeMatcher::CreateLikeMatcher((LikeMatcher *)local_c0,(string *)(local_c0 + 0x10),'\0');
        *(undefined8 *)this = local_c0._0_8_;
        local_c0._0_8_ = (_func_int **)0x0;
        if ((undefined1 *)local_c0._16_8_ != local_c0 + 0x20) {
          operator_delete((void *)local_c0._16_8_);
        }
        Value::~Value((Value *)(local_80 + 0x10));
      }
      return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
             (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
    }
    pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(this_00);
    if ((pEVar3->return_type).id_ == VARCHAR) {
      pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(this_00);
      StringType::GetCollation_abi_cxx11_
                ((string *)(local_c0 + 0x30),(StringType *)&pEVar3->return_type,type);
      bVar6 = local_88 != (pointer)0x0;
      if ((pointer)local_c0._48_8_ != (pointer)local_80) {
        operator_delete((void *)local_c0._48_8_);
      }
    }
    else {
      bVar6 = false;
    }
    if (bVar6) {
      *(undefined8 *)this = 0;
      if (!bVar5) {
        return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
               (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
      }
      goto LAB_014dd868;
    }
    this_00 = this_00 + 1;
  } while( true );
}

Assistant:

static unique_ptr<FunctionData> LikeBindFunction(ClientContext &context, ScalarFunction &bound_function,
                                                 vector<unique_ptr<Expression>> &arguments) {
	// pattern is the second argument. If its constant, we can already prepare the pattern and store it for later.
	D_ASSERT(arguments.size() == 2 || arguments.size() == 3);
	for (auto &arg : arguments) {
		if (arg->return_type.id() == LogicalTypeId::VARCHAR && !StringType::GetCollation(arg->return_type).empty()) {
			return nullptr;
		}
	}
	if (arguments[1]->IsFoldable()) {
		Value pattern_str = ExpressionExecutor::EvaluateScalar(context, *arguments[1]);
		return LikeMatcher::CreateLikeMatcher(pattern_str.ToString());
	}
	return nullptr;
}